

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

double anon_unknown.dwarf_1f8e8::sampleX<Imath_3_2::half>
                 (TypedImageChannel<Imath_3_2::half> *channel,int w,double x,int y,Extrapolation ext
                 )

{
  uint x_00;
  float fVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  half *phVar5;
  long lVar6;
  uint x_01;
  double dVar7;
  double dVar8;
  
  if (0.0 <= x) {
    x_01 = (uint)x;
  }
  else {
    dVar7 = -x;
    x_01 = -((uint)((double)(int)dVar7 < dVar7) + (int)dVar7);
  }
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar8 = 0.0;
    dVar7 = 0.0;
    if ((int)x_01 < w && -1 < (int)x_01) {
      dVar7 = (double)*(float *)(_imath_half_to_float_table +
                                (ulong)(channel->_pixels)._data
                                       [(long)y * (channel->_pixels)._sizeY + (ulong)x_01]._h * 4);
    }
    if (w <= (int)x_00 || (int)x_01 < -1) goto LAB_0010949a;
    phVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY + (long)(int)x_00;
    break;
  case CLAMP:
    uVar3 = w - 1;
    uVar4 = uVar3;
    if ((int)x_01 < (int)uVar3) {
      uVar4 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar4 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar3 = 0;
    }
    phVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY;
    fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar5[(int)uVar4]._h * 4);
    goto LAB_001093c3;
  case PERIODIC:
    if ((int)x_01 < 0) {
      if (-1 < w) {
        uVar3 = (~x_01 + w) / (uint)w;
        goto LAB_001093f6;
      }
      uVar3 = (~w - x_01) / (uint)-w;
    }
    else if (w < 0) {
      uVar3 = x_01 / (uint)-w;
LAB_001093f6:
      uVar3 = -uVar3;
    }
    else {
      uVar3 = x_01 / (uint)w;
    }
    if ((int)x_01 < -1) {
      if (-1 < w) {
        uVar4 = ((w - x_01) - 2) / (uint)w;
        goto LAB_00109444;
      }
      uVar4 = (~w - x_00) / (uint)-w;
    }
    else if (w < 0) {
      uVar4 = x_00 / (uint)-w;
LAB_00109444:
      uVar4 = -uVar4;
    }
    else {
      uVar4 = x_00 / (uint)w;
    }
    lVar6 = (long)y * (channel->_pixels)._sizeY;
    phVar5 = (channel->_pixels)._data;
    dVar7 = (double)*(float *)(_imath_half_to_float_table +
                              (ulong)phVar5[lVar6 + (int)(x_01 - uVar3 * w)]._h * 4);
    phVar5 = phVar5 + lVar6 + (int)(x_00 - uVar4 * w);
    break;
  case MIRROR:
    iVar2 = mirror(x_01,w);
    uVar3 = mirror(x_00,w);
    phVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY;
    fVar1 = *(float *)(_imath_half_to_float_table + (ulong)phVar5[iVar2]._h * 4);
LAB_001093c3:
    dVar7 = (double)fVar1;
    phVar5 = phVar5 + (int)uVar3;
    break;
  default:
    dVar7 = 0.0;
    dVar8 = 0.0;
    goto LAB_0010949a;
  }
  dVar8 = (double)*(float *)(_imath_half_to_float_table + (ulong)phVar5->_h * 4);
LAB_0010949a:
  return ((double)(int)x_00 - x) * dVar7 + (1.0 - ((double)(int)x_00 - x)) * dVar8;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}